

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O1

void SendConAck(int num_connected,int num_needed)

{
  sockaddr_in *__addr;
  long lVar1;
  PreGamePacket packet;
  undefined2 local_64;
  undefined1 local_62;
  undefined1 local_61;
  
  local_64 = 0x430;
  local_62 = (undefined1)num_needed;
  local_61 = (undefined1)num_connected;
  if (1 < doomcom.numnodes) {
    lVar1 = 1;
    __addr = sendaddress;
    do {
      __addr = __addr + 1;
      sendto(mysocket,&local_64,4,0,(sockaddr *)__addr,0x10);
      lVar1 = lVar1 + 1;
    } while (lVar1 < doomcom.numnodes);
  }
  (*StartScreen->_vptr_FStartupScreen[6])(StartScreen,(ulong)(uint)(int)doomcom.numnodes);
  return;
}

Assistant:

static void SendConAck (int num_connected, int num_needed)
{
	PreGamePacket packet;

	packet.Fake = PRE_FAKE;
	packet.Message = PRE_CONACK;
	packet.NumNodes = num_needed;
	packet.NumPresent = num_connected;
	for (int node = 1; node < doomcom.numnodes; ++node)
	{
		PreSend (&packet, 4, &sendaddress[node]);
	}
	StartScreen->NetProgress (doomcom.numnodes);
}